

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O0

char * llama_print_system_info(void)

{
  int iVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb20;
  undefined8 in_stack_fffffffffffffb58;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430 [24];
  undefined1 local_130 [304];
  
  iVar3 = (int)((ulong)in_stack_fffffffffffffb58 >> 0x20);
  if (llama_print_system_info()::s_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&llama_print_system_info()::s_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string(in_stack_fffffffffffffb20);
      __cxa_atexit(std::__cxx11::string::~string,&llama_print_system_info()::s_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&llama_print_system_info()::s_abi_cxx11_);
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08);
  ggml_cpu_has_avx();
  std::__cxx11::to_string(iVar3);
  std::operator+((char *)in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
  std::operator+(in_stack_fffffffffffffb18,(char *)in_stack_fffffffffffffb10);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  std::__cxx11::string::~string(in_stack_fffffffffffffb10);
  std::__cxx11::string::~string(in_stack_fffffffffffffb10);
  std::__cxx11::string::~string(in_stack_fffffffffffffb10);
  ggml_cpu_has_avx2();
  std::__cxx11::to_string(iVar3);
  std::operator+((char *)in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
  std::operator+(in_stack_fffffffffffffb18,(char *)in_stack_fffffffffffffb10);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  std::__cxx11::string::~string(in_stack_fffffffffffffb10);
  std::__cxx11::string::~string(in_stack_fffffffffffffb10);
  std::__cxx11::string::~string(in_stack_fffffffffffffb10);
  ggml_cpu_has_avx512();
  iVar3 = (int)((ulong)local_130 >> 0x20);
  std::__cxx11::to_string(iVar3);
  std::operator+((char *)in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
  std::operator+(in_stack_fffffffffffffb18,(char *)in_stack_fffffffffffffb10);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  std::__cxx11::string::~string(in_stack_fffffffffffffb10);
  std::__cxx11::string::~string(in_stack_fffffffffffffb10);
  std::__cxx11::string::~string(in_stack_fffffffffffffb10);
  ggml_cpu_has_fma();
  std::__cxx11::to_string(iVar3);
  std::operator+((char *)in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
  std::operator+(in_stack_fffffffffffffb18,(char *)in_stack_fffffffffffffb10);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  std::__cxx11::string::~string(in_stack_fffffffffffffb10);
  std::__cxx11::string::~string(in_stack_fffffffffffffb10);
  std::__cxx11::string::~string(in_stack_fffffffffffffb10);
  ggml_cpu_has_neon();
  std::__cxx11::to_string(iVar3);
  std::operator+((char *)in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
  std::operator+(in_stack_fffffffffffffb18,(char *)in_stack_fffffffffffffb10);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  std::__cxx11::string::~string(in_stack_fffffffffffffb10);
  std::__cxx11::string::~string(in_stack_fffffffffffffb10);
  std::__cxx11::string::~string(in_stack_fffffffffffffb10);
  ggml_cpu_has_arm_fma();
  std::__cxx11::to_string(iVar3);
  std::operator+((char *)in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
  std::operator+(in_stack_fffffffffffffb18,(char *)in_stack_fffffffffffffb10);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  std::__cxx11::string::~string(in_stack_fffffffffffffb10);
  std::__cxx11::string::~string(in_stack_fffffffffffffb10);
  std::__cxx11::string::~string(in_stack_fffffffffffffb10);
  ggml_cpu_has_f16c();
  std::__cxx11::to_string(iVar3);
  std::operator+((char *)in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
  std::operator+(in_stack_fffffffffffffb18,(char *)in_stack_fffffffffffffb10);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  std::__cxx11::string::~string(in_stack_fffffffffffffb10);
  std::__cxx11::string::~string(in_stack_fffffffffffffb10);
  std::__cxx11::string::~string(in_stack_fffffffffffffb10);
  ggml_cpu_has_fp16_va();
  std::__cxx11::to_string(iVar3);
  std::operator+((char *)in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
  std::operator+(in_stack_fffffffffffffb18,(char *)in_stack_fffffffffffffb10);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  std::__cxx11::string::~string(in_stack_fffffffffffffb10);
  std::__cxx11::string::~string(in_stack_fffffffffffffb10);
  std::__cxx11::string::~string(in_stack_fffffffffffffb10);
  ggml_cpu_has_wasm_simd();
  std::__cxx11::to_string(iVar3);
  std::operator+((char *)in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
  std::operator+(in_stack_fffffffffffffb18,(char *)in_stack_fffffffffffffb10);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  std::__cxx11::string::~string(in_stack_fffffffffffffb10);
  std::__cxx11::string::~string(in_stack_fffffffffffffb10);
  std::__cxx11::string::~string(in_stack_fffffffffffffb10);
  ggml_cpu_has_blas();
  std::__cxx11::to_string(iVar3);
  std::operator+((char *)in_stack_fffffffffffffb18,in_stack_fffffffffffffb10);
  std::operator+(in_stack_fffffffffffffb18,(char *)in_stack_fffffffffffffb10);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  std::__cxx11::string::~string(in_stack_fffffffffffffb10);
  std::__cxx11::string::~string(in_stack_fffffffffffffb10);
  std::__cxx11::string::~string(in_stack_fffffffffffffb10);
  ggml_cpu_has_sse3();
  __lhs = local_430;
  std::__cxx11::to_string(iVar3);
  std::operator+((char *)__lhs,in_stack_fffffffffffffb10);
  std::operator+(__lhs,(char *)in_stack_fffffffffffffb10);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  std::__cxx11::string::~string(in_stack_fffffffffffffb10);
  std::__cxx11::string::~string(in_stack_fffffffffffffb10);
  std::__cxx11::string::~string(in_stack_fffffffffffffb10);
  ggml_cpu_has_vsx();
  __rhs = local_490;
  std::__cxx11::to_string(iVar3);
  std::operator+((char *)__lhs,__rhs);
  std::operator+(__lhs,(char *)__rhs);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (__rhs,in_stack_fffffffffffffb08);
  std::__cxx11::string::~string(__rhs);
  std::__cxx11::string::~string(__rhs);
  std::__cxx11::string::~string(__rhs);
  pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (__rhs);
  return pcVar2;
}

Assistant:

const char * llama_print_system_info(void) {
    static std::string s;

    s  = "";
    s += "AVX = "       + std::to_string(ggml_cpu_has_avx())       + " | ";
    s += "AVX2 = "      + std::to_string(ggml_cpu_has_avx2())      + " | ";
    s += "AVX512 = "    + std::to_string(ggml_cpu_has_avx512())    + " | ";
    s += "FMA = "       + std::to_string(ggml_cpu_has_fma())       + " | ";
    s += "NEON = "      + std::to_string(ggml_cpu_has_neon())      + " | ";
    s += "ARM_FMA = "   + std::to_string(ggml_cpu_has_arm_fma())   + " | ";
    s += "F16C = "      + std::to_string(ggml_cpu_has_f16c())      + " | ";
    s += "FP16_VA = "   + std::to_string(ggml_cpu_has_fp16_va())   + " | ";
    s += "WASM_SIMD = " + std::to_string(ggml_cpu_has_wasm_simd()) + " | ";
    s += "BLAS = "      + std::to_string(ggml_cpu_has_blas())      + " | ";
    s += "SSE3 = "      + std::to_string(ggml_cpu_has_sse3())      + " | ";
    s += "VSX = "       + std::to_string(ggml_cpu_has_vsx())       + " | ";

    return s.c_str();
}